

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void floatstr(Context *ctx,char *buf,size_t bufsize,float f,int leavedecimal)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  sVar2 = MOJOSHADER_printFloat(buf,0x20,f);
  if (sVar2 - 0x1e < 0xffffffffffffffe0) {
    failf(ctx,"%s","BUG: internal buffer is too small");
    return;
  }
  pcVar3 = strchr(buf,0x2e);
  if (pcVar3 == (char *)0x0) {
    if ((int)bufsize != 0) {
      sVar4 = strlen(buf);
      (buf + sVar4)[0] = '.';
      (buf + sVar4)[1] = '0';
      buf[sVar4 + 2] = '\0';
    }
  }
  else {
    pcVar1 = buf + sVar2;
    do {
      pcVar6 = pcVar1 + -1;
      pcVar5 = pcVar3;
      if (pcVar6 == pcVar3) break;
      pcVar5 = pcVar1;
      pcVar1 = pcVar6;
    } while (*pcVar6 == '0');
    pcVar5[(ulong)(pcVar5 == pcVar3 && (int)bufsize != 0) * 2] = '\0';
  }
  return;
}

Assistant:

static void floatstr(Context *ctx, char *buf, size_t bufsize, float f,
                     int leavedecimal)
{
    const size_t len = MOJOSHADER_printFloat(buf, bufsize, f);
    if ((len+2) >= bufsize)
        fail(ctx, "BUG: internal buffer is too small");
    else
    {
        char *end = buf + len;
        char *ptr = strchr(buf, '.');
        if (ptr == NULL)
        {
            if (leavedecimal)
                strcat(buf, ".0");
            return;  // done.
        } // if

        while (--end != ptr)
        {
            if (*end != '0')
            {
                end++;
                break;
            } // if
        } // while
        if ((leavedecimal) && (end == ptr))
            end += 2;
        *end = '\0';  // chop extra '0' or all decimal places off.
    } // else
}